

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O0

int check_possible_values(char *val,char **values)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  long in_RSI;
  char *in_RDI;
  size_t len;
  int last;
  int found;
  int i;
  int local_24;
  int local_20;
  int local_1c;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = -1;
  }
  else {
    local_24 = 0;
    local_20 = 0;
    local_1c = 0;
    __n = strlen(in_RDI);
    while (*(long *)(in_RSI + (long)local_1c * 8) != 0) {
      iVar1 = strncmp(in_RDI,*(char **)(in_RSI + (long)local_1c * 8),__n);
      if (iVar1 == 0) {
        local_20 = local_20 + 1;
        local_24 = local_1c;
        sVar2 = strlen(*(char **)(in_RSI + (long)local_1c * 8));
        if (sVar2 == __n) {
          return local_1c;
        }
      }
      local_1c = local_1c + 1;
    }
    if (local_20 == 1) {
      local_4 = local_24;
    }
    else {
      local_4 = -1;
      if (local_20 != 0) {
        local_4 = -2;
      }
    }
  }
  return local_4;
}

Assistant:

static int
check_possible_values(const char *val, const char *values[])
{
  int i, found, last;
  size_t len;

  if (!val)   /* otherwise strlen() crashes below */
    return -1; /* -1 means no argument for the option */

  found = last = 0;

  for (i = 0, len = strlen(val); values[i]; ++i)
    {
      if (strncmp(val, values[i], len) == 0)
        {
          ++found;
          last = i;
          if (strlen(values[i]) == len)
            return i; /* exact macth no need to check more */
        }
    }

  if (found == 1) /* one match: OK */
    return last;

  return (found ? -2 : -1); /* return many values or none matched */
}